

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_foreach::preprocess
          (method_foreach *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  var_id *this_00;
  tree_type<cs::token_base_*> *t;
  string *in_stack_ffffffffffffff38;
  internal_error *in_stack_ffffffffffffff40;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff50;
  allocator *paVar5;
  allocator local_89;
  string local_88 [8];
  iterator *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa8;
  domain_manager *in_stack_ffffffffffffffb0;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffff50);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff38);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff80);
  if (*pptVar3 == (token_base *)0x0) {
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Null pointer accessed.",(allocator *)&stack0xffffffffffffffb7);
    internal_error::internal_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
  }
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff38);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff80);
  iVar1 = (*(*pptVar3)->_vptr_token_base[2])();
  if (iVar1 != 4) {
    uVar4 = __cxa_allocate_exception(0x28);
    paVar5 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Wrong grammar in foreach statement, expect <id>",paVar5);
    compile_error::compile_error
              ((compile_error *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x55bb92);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x55bb9e);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff38);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff80);
  this_00 = token_id::get_id((token_id *)*pptVar3);
  var_id::operator_cast_to_string_(this_00);
  domain_manager::add_record(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void method_foreach::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar in foreach statement, expect <id>");
		context->instance->storage.add_record(static_cast<token_id *>(t.root().data())->get_id());
	}